

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Initialize.cpp
# Opt level: O1

void __thiscall
glslang::TBuiltIns::addQueryFunctions
          (TBuiltIns *this,TSampler sampler,TString *typeName,int version,EProfile profile)

{
  TString *this_00;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *this_01;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *this_02;
  long lVar1;
  byte bVar2;
  int iVar3;
  char *pcVar4;
  bool bVar5;
  TString funcName [2];
  char local_d0;
  pool_allocator<char> local_98;
  pool_allocator<char> local_90;
  basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> local_88 [8];
  size_type local_80 [4];
  basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> local_60 [48];
  
  bVar2 = sampler._1_1_;
  if ((((((uint)sampler >> 0x13 & 1) == 0) || (((uint)sampler & 0xff00) == 0x700)) ||
      (((uint)sampler & 0xff00) == 0x800)) ||
     ((0x135 < version || profile != EEsProfile && (0x1a3 < version || profile == EEsProfile)))) {
    iVar3 = (this->dimMap[bVar2] + (uint)(((uint)sampler >> 0x10 & 1) != 0)) - (uint)(bVar2 == 4);
    if (profile == EEsProfile) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      append(&(this->super_TBuiltInParseables).commonBuiltins,"highp ");
    }
    this_00 = &(this->super_TBuiltInParseables).commonBuiltins;
    if (iVar3 == 1) {
      pcVar4 = "int";
    }
    else {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      append(this_00,"ivec");
      pcVar4 = this->postfixes[iVar3];
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
              (this_00,pcVar4);
    pcVar4 = " imageSize(readonly writeonly volatile coherent nontemporal ";
    if (((int)sampler - 0x700U & 0xffff) < 0x200) {
      pcVar4 = " textureSize(";
    }
    if (((uint)sampler >> 0x13 & 1) == 0) {
      pcVar4 = " textureSize(";
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
              (this_00,pcVar4);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
    _M_append(this_00,(typeName->_M_dataplus)._M_p,typeName->_M_string_length);
    if ((((((uint)sampler >> 0x13 & 1) == 0) || (((uint)sampler & 0xff00) == 0x800)) ||
        (((uint)sampler & 0xff00) == 0x700)) &&
       (((((uint)sampler & 0xff00) != 0x500 && (((uint)sampler & 0xff00) != 0x600)) &&
        (((uint)sampler >> 0x12 & 1) == 0)))) {
      pcVar4 = ",int);\n";
    }
    else {
      pcVar4 = ");\n";
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
              (this_00,pcVar4);
    if (((uint)sampler >> 0x12 & 1) != 0 && (0x1ad < version && profile != EEsProfile)) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      append(this_00,"int ");
      pcVar4 = "imageSamples(readonly writeonly volatile coherent nontemporal ";
      if (((int)sampler - 0x700U & 0xffff) < 0x200) {
        pcVar4 = "textureSamples(";
      }
      if (((uint)sampler >> 0x13 & 1) == 0) {
        pcVar4 = "textureSamples(";
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      append(this_00,pcVar4);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      _M_append(this_00,(typeName->_M_dataplus)._M_p,typeName->_M_string_length);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      append(this_00,");\n");
    }
    if ((((0x95 < version && profile != EEsProfile) && ((uint)sampler & 0x140000) == 0x100000) &&
        (((uint)sampler & 0xff00) != 0x500)) && (((uint)sampler & 0xff00) != 0x600)) {
      local_90.allocator = GetThreadPoolAllocator();
      std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
      basic_string<glslang::std::allocator<char>>(local_88,"vec2 textureQueryLod(",&local_90);
      local_98.allocator = GetThreadPoolAllocator();
      std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
      basic_string<glslang::std::allocator<char>>(local_60,"vec2 textureQueryLOD(",&local_98);
      local_d0 = sampler._0_1_;
      this_01 = (this->super_TBuiltInParseables).stageBuiltins + 4;
      this_02 = (this->super_TBuiltInParseables).stageBuiltins + 5;
      lVar1 = 0;
      do {
        iVar3 = 1;
        do {
          if (local_d0 == '\x03' || iVar3 == 1) {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
            ::_M_append(this_01,(char *)local_80[lVar1 * 5],local_80[lVar1 * 5 + 1]);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
            ::_M_append(this_01,(typeName->_M_dataplus)._M_p,typeName->_M_string_length);
            if (this->dimMap[bVar2] == 1) {
              if (iVar3 == 1) {
                pcVar4 = ", float";
              }
              else {
                pcVar4 = ", float16_t";
              }
            }
            else {
              pcVar4 = ", f16vec";
              if (iVar3 == 1) {
                pcVar4 = ", vec";
              }
              std::__cxx11::
              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
                        (this_01,pcVar4);
              pcVar4 = this->postfixes[this->dimMap[bVar2]];
            }
            std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
            ::append(this_01,pcVar4);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
            ::append(this_01,");\n");
          }
          iVar3 = iVar3 + -1;
        } while (iVar3 == 0);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        _M_append(this_02,(char *)local_80[lVar1 * 5],local_80[lVar1 * 5 + 1]);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        _M_append(this_02,(typeName->_M_dataplus)._M_p,typeName->_M_string_length);
        if (this->dimMap[bVar2] == 1) {
          pcVar4 = ", float";
        }
        else {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          append(this_02,", vec");
          pcVar4 = this->postfixes[this->dimMap[bVar2]];
        }
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        append(this_02,pcVar4);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        append(this_02,");\n");
        bVar5 = lVar1 == 0;
        lVar1 = lVar1 + 1;
      } while (bVar5);
    }
    if ((0x1ad < version && profile != EEsProfile) &&
       ((((((uint)sampler >> 0x13 & 1) == 0 || (((uint)sampler & 0xff00) == 0x800)) ||
         (((uint)sampler & 0xff00) == 0x700)) &&
        (((((uint)sampler >> 0x12 & 1) == 0 && (((uint)sampler & 0xff00) != 0x500)) &&
         (((uint)sampler & 0xff00) != 0x600)))))) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      append(this_00,"int textureQueryLevels(");
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      _M_append(this_00,(typeName->_M_dataplus)._M_p,typeName->_M_string_length);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      append(this_00,");\n");
    }
  }
  return;
}

Assistant:

void TBuiltIns::addQueryFunctions(TSampler sampler, const TString& typeName, int version, EProfile profile)
{
    //
    // textureSize() and imageSize()
    //

    int sizeDims = dimMap[sampler.dim] + (sampler.arrayed ? 1 : 0) - (sampler.dim == EsdCube ? 1 : 0);

    if (sampler.isImage() && ((profile == EEsProfile && version < 310) || (profile != EEsProfile && version < 420)))
        return;

    if (profile == EEsProfile)
        commonBuiltins.append("highp ");
    if (sizeDims == 1)
        commonBuiltins.append("int");
    else {
        commonBuiltins.append("ivec");
        commonBuiltins.append(postfixes[sizeDims]);
    }
    if (sampler.isImage())
        commonBuiltins.append(" imageSize(readonly writeonly volatile coherent nontemporal ");
    else
        commonBuiltins.append(" textureSize(");
    commonBuiltins.append(typeName);
    if (! sampler.isImage() && ! sampler.isRect() && ! sampler.isBuffer() && ! sampler.isMultiSample())
        commonBuiltins.append(",int);\n");
    else
        commonBuiltins.append(");\n");

    //
    // textureSamples() and imageSamples()
    //

    // GL_ARB_shader_texture_image_samples
    // TODO: spec issue? there are no memory qualifiers; how to query a writeonly/readonly image, etc?
    if (profile != EEsProfile && version >= 430 && sampler.isMultiSample()) {
        commonBuiltins.append("int ");
        if (sampler.isImage())
            commonBuiltins.append("imageSamples(readonly writeonly volatile coherent nontemporal ");
        else
            commonBuiltins.append("textureSamples(");
        commonBuiltins.append(typeName);
        commonBuiltins.append(");\n");
    }

    //
    // textureQueryLod(), fragment stage only
    // Also enabled with extension GL_ARB_texture_query_lod
    // Extension GL_ARB_texture_query_lod says that textureQueryLOD() also exist at extension.

    if (profile != EEsProfile && version >= 150 && sampler.isCombined() && sampler.dim != EsdRect &&
        ! sampler.isMultiSample() && ! sampler.isBuffer()) {

        const TString funcName[2] = {"vec2 textureQueryLod(", "vec2 textureQueryLOD("};

        for (int i = 0; i < 2; ++i){
            for (int f16TexAddr = 0; f16TexAddr < 2; ++f16TexAddr) {
                if (f16TexAddr && sampler.type != EbtFloat16)
                    continue;
                stageBuiltins[EShLangFragment].append(funcName[i]);
                stageBuiltins[EShLangFragment].append(typeName);
                if (dimMap[sampler.dim] == 1)
                    if (f16TexAddr)
                        stageBuiltins[EShLangFragment].append(", float16_t");
                    else
                        stageBuiltins[EShLangFragment].append(", float");
                else {
                    if (f16TexAddr)
                        stageBuiltins[EShLangFragment].append(", f16vec");
                    else
                        stageBuiltins[EShLangFragment].append(", vec");
                    stageBuiltins[EShLangFragment].append(postfixes[dimMap[sampler.dim]]);
                }
                stageBuiltins[EShLangFragment].append(");\n");
            }

            stageBuiltins[EShLangCompute].append(funcName[i]);
            stageBuiltins[EShLangCompute].append(typeName);
            if (dimMap[sampler.dim] == 1)
                stageBuiltins[EShLangCompute].append(", float");
            else {
                stageBuiltins[EShLangCompute].append(", vec");
                stageBuiltins[EShLangCompute].append(postfixes[dimMap[sampler.dim]]);
            }
            stageBuiltins[EShLangCompute].append(");\n");
        }
    }

    //
    // textureQueryLevels()
    //

    if (profile != EEsProfile && version >= 430 && ! sampler.isImage() && sampler.dim != EsdRect &&
        ! sampler.isMultiSample() && ! sampler.isBuffer()) {
        commonBuiltins.append("int textureQueryLevels(");
        commonBuiltins.append(typeName);
        commonBuiltins.append(");\n");
    }
}